

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O3

void __thiscall amrex::EB2::Level::fillLevelSet(Level *this,MultiFab *levelset,Geometry *geom)

{
  int *piVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  element_type *peVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  pointer ppVar8;
  int i;
  int iVar9;
  uint uVar10;
  Periodicity *period;
  long lVar11;
  ulong uVar12;
  pointer pIVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  int i_2;
  int iVar17;
  bool bVar18;
  int iVar19;
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  Periodicity PVar23;
  Box r;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  Box bx;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_110;
  pointer local_f8;
  FabArray<amrex::FArrayBox> *local_f0;
  pointer local_e8;
  pointer local_e0;
  long local_d8;
  MFIter mfi;
  Array4<double> local_70;
  
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&levelset->super_FabArray<amrex::FArrayBox>,-1.0,0,
             (levelset->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,
             &(levelset->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow);
  period = Periodicity::NonPeriodic();
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
  mfi.fabArray._0_4_ = 0;
  local_70.p = (double *)0x0;
  local_70.jstride._0_4_ = 0;
  FabArray<amrex::FArrayBox>::ParallelCopy_nowait
            (&levelset->super_FabArray<amrex::FArrayBox>,
             &(this->m_levelset).super_FabArray<amrex::FArrayBox>,0,0,1,(IntVect *)&mfi,
             (IntVect *)&local_70,period,COPY,(CPC *)0x0,false);
  PVar23 = Geometry::periodicity(geom);
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl = PVar23.period.vect._0_8_;
  mfi.fabArray._0_4_ = PVar23.period.vect[2];
  Periodicity::shiftIntVect(&local_110,(Periodicity *)&mfi);
  peVar5 = (this->m_covered_grids).m_ref.
           super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar5->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      *(pointer *)
       ((long)&(peVar5->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data + 8)) {
    isects.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    isects.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    isects.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    MFIter::MFIter(&mfi,(FabArrayBase *)levelset,'\0');
    if (mfi.currentIndex < mfi.endIndex) {
      local_f0 = &levelset->super_FabArray<amrex::FArrayBox>;
      do {
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_70,&levelset->super_FabArray<amrex::FArrayBox>,&mfi);
        FabArrayBase::fabbox
                  (&r,(FabArrayBase *)CONCAT44(mfi.fabArray._4_4_,(int)mfi.fabArray),
                   ((mfi.index_map)->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[mfi.currentIndex]);
        bx.bigend.vect[1] = r.bigend.vect[1];
        bx.bigend.vect[2] = r.bigend.vect[2];
        bx.btype.itype = r.btype.itype;
        bx.smallend.vect[0] = r.smallend.vect[0];
        bx.smallend.vect[1] = r.smallend.vect[1];
        bx.smallend.vect[2] = r.smallend.vect[2];
        bx.bigend.vect[0] = r.bigend.vect[0];
        lVar11 = 0;
        do {
          if ((bx.btype.itype >> ((uint)lVar11 & 0x1f) & 1) != 0) {
            piVar1 = bx.bigend.vect + lVar11;
            *piVar1 = *piVar1 + -1;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
        bx._20_8_ = bx._20_8_ & 0xffffffff;
        local_f8 = local_110.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        pIVar13 = local_110.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (local_110.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_110.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          do {
            r.btype = bx.btype;
            r.smallend.vect[0] = bx.smallend.vect[0] + (int)*(undefined8 *)pIVar13->vect;
            r.smallend.vect[1] =
                 bx.smallend.vect[1] + (int)((ulong)*(undefined8 *)pIVar13->vect >> 0x20);
            r.smallend.vect[2] = bx.smallend.vect[2] + pIVar13->vect[2];
            r.bigend.vect[0] = bx.bigend.vect[0] + pIVar13->vect[0];
            r.bigend.vect[1] = bx.bigend.vect[1] + pIVar13->vect[1];
            r.bigend.vect[2] = bx.bigend.vect[2] + pIVar13->vect[2];
            BoxArray::intersections(&this->m_covered_grids,&r,&isects);
            auVar7 = _DAT_0074fb40;
            auVar6 = _DAT_0074fb30;
            local_e8 = isects.
                       super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            if (isects.
                super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                isects.
                super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              iVar19 = (int)*(undefined8 *)pIVar13->vect;
              iVar20 = (int)((ulong)*(undefined8 *)pIVar13->vect >> 0x20);
              iVar3 = pIVar13->vect[2];
              ppVar8 = isects.
                       super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              do {
                local_e0 = ppVar8;
                iVar4 = (local_e0->second).smallend.vect[0];
                iVar9 = (local_e0->second).smallend.vect[1] - iVar20;
                r.btype.itype = (local_e0->second).btype.itype;
                iVar17 = iVar4 - iVar19;
                iVar16 = (local_e0->second).smallend.vect[2] - iVar3;
                uVar2 = *(undefined8 *)(local_e0->second).bigend.vect;
                r.bigend.vect[0] = (int)uVar2 - iVar19;
                r.bigend.vect[1] = (int)((ulong)uVar2 >> 0x20) - iVar20;
                r.bigend.vect[2] = (local_e0->second).bigend.vect[2] - iVar3;
                lVar11 = 0;
                do {
                  if ((r.btype.itype >> ((uint)lVar11 & 0x1f) & 1) == 0) {
                    piVar1 = r.bigend.vect + lVar11;
                    *piVar1 = *piVar1 + 1;
                  }
                  lVar11 = lVar11 + 1;
                } while (lVar11 != 3);
                if (iVar16 <= r.bigend.vect[2]) {
                  uVar10 = (iVar19 + r.bigend.vect[0]) - iVar4;
                  auVar21._4_4_ = 0;
                  auVar21._0_4_ = uVar10;
                  auVar21._8_4_ = uVar10;
                  auVar21._12_4_ = 0;
                  local_d8 = (long)iVar17 * 8;
                  auVar21 = auVar21 ^ auVar7;
                  do {
                    if (iVar9 <= r.bigend.vect[1]) {
                      lVar14 = CONCAT44(local_70.jstride._4_4_,(undefined4)local_70.jstride) * 8;
                      lVar15 = (long)local_70.p +
                               ((long)iVar9 - (long)local_70.begin.y) * lVar14 +
                               ((long)iVar16 - (long)local_70.begin.z) * local_70.kstride * 8 +
                               (long)local_70.begin.x * -8 + local_d8 + 8;
                      lVar11 = (long)iVar9;
                      do {
                        if (iVar17 <= r.bigend.vect[0]) {
                          uVar12 = 0;
                          do {
                            auVar22._8_4_ = (int)uVar12;
                            auVar22._0_8_ = uVar12;
                            auVar22._12_4_ = (int)(uVar12 >> 0x20);
                            auVar22 = (auVar22 | auVar6) ^ auVar7;
                            if ((bool)(~(auVar21._4_4_ < auVar22._4_4_ ||
                                        auVar21._0_4_ < auVar22._0_4_ &&
                                        auVar22._4_4_ == auVar21._4_4_) & 1)) {
                              *(undefined8 *)(lVar15 + -8 + uVar12 * 8) = 0x3ff0000000000000;
                            }
                            if (auVar22._12_4_ <= auVar21._12_4_ &&
                                (auVar22._8_4_ <= auVar21._8_4_ || auVar22._12_4_ != auVar21._12_4_)
                               ) {
                              *(undefined8 *)(lVar15 + uVar12 * 8) = 0x3ff0000000000000;
                            }
                            uVar12 = uVar12 + 2;
                          } while (((ulong)uVar10 + 2 & 0xfffffffffffffffe) != uVar12);
                        }
                        lVar11 = lVar11 + 1;
                        lVar15 = lVar15 + lVar14;
                      } while (r.bigend.vect[1] + 1 != (int)lVar11);
                    }
                    bVar18 = iVar16 != r.bigend.vect[2];
                    iVar16 = iVar16 + 1;
                  } while (bVar18);
                }
                ppVar8 = local_e0 + 1;
                levelset = (MultiFab *)local_f0;
              } while (local_e0 + 1 !=
                       isects.
                       super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            }
            pIVar13 = pIVar13 + 1;
          } while (pIVar13 != local_f8);
        }
        MFIter::operator++(&mfi);
      } while (mfi.currentIndex < mfi.endIndex);
    }
    MFIter::~MFIter(&mfi);
    if (isects.
        super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(isects.
                      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)isects.
                            super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)isects.
                            super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_110.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_110.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
Level::fillLevelSet (MultiFab& levelset, const Geometry& geom) const
{
    levelset.setVal(-1.0);
    levelset.ParallelCopy(m_levelset,0,0,1,0,0);

    const std::vector<IntVect>& pshifts = geom.periodicity().shiftIntVect();

    Real cov_val = 1.0; // for covered cells

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    if (!m_covered_grids.empty())
    {
        std::vector<std::pair<int,Box> > isects;
        for (MFIter mfi(levelset); mfi.isValid(); ++mfi)
        {
            const auto& lsfab = levelset.array(mfi);
            const Box& ccbx = amrex::enclosedCells(mfi.fabbox());
            for (const auto& iv : pshifts)
            {
                m_covered_grids.intersections(ccbx+iv, isects);
                for (const auto& is : isects) {
                    const Box& fbx = amrex::surroundingNodes(is.second-iv);
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D(fbx, i, j, k,
                    {
                        lsfab(i,j,k) = cov_val;
                    });
                }
            }
        }
    }
}